

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BuiltIn builtin;
  uint32_t uVar6;
  SPIRVariable *pSVar7;
  SPIRType *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  size_type sVar11;
  undefined8 *puVar12;
  char *pcVar13;
  _Base_ptr p_Var14;
  char (*ts_1) [2];
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Base_ptr p_Var17;
  uint uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  bool bVar19;
  string *decl;
  string address_space;
  string local_d8;
  ID local_b8;
  byte local_b1;
  SPIRType *local_b0;
  ulong local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  long local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  SPIRType *local_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  pSVar7 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  pSVar8 = Compiler::get_variable_data_type((Compiler *)this,pSVar7);
  local_80 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  local_b1 = local_80->pointer;
  uVar6 = (pSVar7->super_IVariant).self.id;
  local_b8.id = (pSVar7->basevariable).id;
  if (local_b8.id == 0) {
    local_b8.id = uVar6;
  }
  if (arg->alias_global_variable == false) {
    local_b8.id = uVar6;
  }
  bVar2 = ~arg->alias_global_variable & arg->write_count == 0 & local_b1;
  iVar5 = *(int *)&(pSVar8->super_IVariant).field_0xc;
  if (((iVar5 == 0x10) && ((pSVar8->image).dim == DimSubpassData)) &&
     ((this->msl_options).platform == iOS)) {
    bVar2 = bVar2 & ((this->msl_options).ios_use_framebuffer_fetch_subpasses ^ 1U);
  }
  local_a8 = (ulong)local_80->storage;
  uVar18 = iVar5 - 0x10;
  if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    bVar2 = uVar18 < 3 | bVar2;
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_b0 = pSVar8;
  if (bVar2 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar19 = false;
  if (((arg->alias_global_variable == false) &&
      (bVar19 = false, *(int *)&(local_b0->super_IVariant).field_0xc == 0x11)) &&
     ((local_b0->image).dim == Dim2D)) {
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (local_b0->image).type.id);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc - 0xcU < 3) {
      p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      p_Var14 = &p_Var1->_M_header;
      for (; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < 0x39]) {
        if (0x38 < (int)p_Var17[1]._M_color) {
          p_Var14 = p_Var17;
        }
      }
      p_Var17 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
         (p_Var17 = p_Var14, 0x39 < (int)p_Var14[1]._M_color)) {
        p_Var17 = &p_Var1->_M_header;
      }
      bVar19 = (_Rb_tree_header *)p_Var17 != p_Var1;
    }
    else {
      bVar19 = false;
    }
  }
  pSVar8 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar7->super_IVariant).field_0xc);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  get_type_address_space_abi_cxx11_(&local_78,this,pSVar8,(pSVar7->super_IVariant).self.id,true);
  bVar3 = Compiler::is_builtin_variable((Compiler *)this,pSVar7);
  this->is_using_builtin_array = bVar3;
  iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
  if (iVar5 == 0) {
    this->is_using_builtin_array = true;
  }
  uVar6 = (pSVar7->basevariable).id;
  if ((uVar6 == 0) ||
     ((uVar6 != (this->stage_in_ptr_var_id).id && (uVar6 != (this->stage_out_ptr_var_id).id)))) {
    if (bVar3) {
      builtin = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
      builtin_type_decl_abi_cxx11_(&local_d8,this,builtin,(arg->id).id);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_00271d91;
    }
    if ((((int)local_a8 == 0xc) || ((int)local_a8 == 2)) &&
       (bVar4 = Compiler::is_array((Compiler *)this,local_b0), bVar4)) {
      this->is_using_builtin_array = true;
      ts_1 = (char (*) [2])(ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_a0,this,local_b0);
      join<std::__cxx11::string,char_const(&)[2]>
                (&local_d8,(spirv_cross *)&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e9e0e,ts_1)
      ;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      paVar9 = &local_90;
      goto LAB_00271d96;
    }
    if (!bVar19) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_d8,this,local_b0,(ulong)(arg->id).id);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_00271d91;
    }
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (local_b0->image).type.id);
    ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(code **)((long)&ts_2[4].field_2 + 8))(&local_a0,this,pSVar8,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
              (&local_d8,(spirv_cross *)"spvDynamicImageSampler<",(char (*) [24])&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e9ac1,
               (char (*) [2])ts_2);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    Compiler::set_extended_decoration
              ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_d8,this,local_b0,(ulong)(arg->id).id);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
LAB_00271d91:
    paVar9 = &local_d8.field_2;
LAB_00271d96:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
      operator_delete((undefined1 *)(&paVar9->_M_allocated_capacity)[-2]);
    }
  }
  pSVar8 = local_b0;
  if (((bVar3 || (int)local_a8 == 0) || ((local_b1 & 1) != 0)) || ((int)local_a8 - 9U < 0xfffffffe))
  {
    bVar19 = Compiler::is_array((Compiler *)this,local_b0);
    if ((uVar18 < 3) || (!bVar19)) {
      if ((int)local_a8 == 0) {
        if (local_78._M_string_length != 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (&local_d8,(spirv_cross *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1,
                     (char (*) [2])__return_storage_ptr__,ts_2);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true)
        ;
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      }
      else {
        if (local_78._M_string_length != 0) {
          if ((__return_storage_ptr__->_M_dataplus)._M_p
              [__return_storage_ptr__->_M_string_length - 1] == '*') {
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_d8,(spirv_cross *)0x2e46c1,(char (*) [2])&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1
                       ,(char (*) [2])ts_2);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_d8,(spirv_cross *)&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1
                       ,(char (*) [2])__return_storage_ptr__,ts_2);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_restrict(this,local_b8.id,true);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true)
        ;
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      }
      goto LAB_00272214;
    }
    if (local_78._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_d8,(spirv_cross *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1,
                 (char (*) [2])__return_storage_ptr__,ts_2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    if ((this->msl_options).argument_buffers == true) {
      uVar6 = Compiler::get_decoration((Compiler *)this,local_b8,DecorationDescriptorSet);
      if (((((int)local_a8 == 0xc) || ((int)local_a8 == 2)) && (uVar6 < 8)) &&
         (((this->msl_options).argument_buffers != false &&
          ((this->argument_buffer_discrete_mask >> (uVar6 & 0x1f) & 1) == 0)))) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar13 = to_restrict(this,local_b8.id,true);
    if (*pcVar13 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_d8,this,pSVar8);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00272227;
  }
  else if (((this->msl_options).force_native_arrays == true) &&
          (bVar19 = Compiler::is_array((Compiler *)this,local_b0), bVar19)) {
    local_a0 = &local_90;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"thread const ","");
    plVar10 = (long *)::std::__cxx11::string::_M_append
                                ((char *)&local_a0,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                                );
    paVar9 = &local_d8.field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_d8.field_2._M_allocated_capacity = *psVar15;
      local_d8.field_2._8_8_ = plVar10[3];
      local_d8._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar15;
      local_d8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_d8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar9) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar8 = local_b0;
    pcVar13 = to_restrict(this,local_b8.id,true);
    if (*pcVar13 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar9) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_d8,this,pSVar8);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar9) goto LAB_00272227;
  }
  else {
    if (local_78._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_d8,(spirv_cross *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1,
                 (char (*) [2])__return_storage_ptr__,ts_2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
LAB_00272214:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00272227;
  }
  operator_delete(local_d8._M_dataplus._M_p);
LAB_00272227:
  pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,local_b8.id);
  if (pSVar7 != (SPIRVariable *)0x0) {
    local_d8._M_dataplus._M_p._0_4_ = (pSVar7->super_IVariant).self.id;
    sVar11 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars)._M_h,(key_type *)&local_d8);
    if (sVar11 != 0) {
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (local_80->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_a0,this,pSVar8,0);
      plVar10 = (long *)::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2f5a4e);
      paVar9 = &local_d8.field_2;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_d8.field_2._M_allocated_capacity = *psVar15;
        local_d8.field_2._8_8_ = plVar10[3];
        local_d8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar15;
        local_d8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_d8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar9) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_b8.id,true);
      plVar10 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2f7a7c);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_90._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_90._8_8_ = plVar10[3];
        local_a0 = &local_90;
      }
      else {
        local_90._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar10;
      }
      local_98 = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_a0);
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_d8.field_2._M_allocated_capacity = *psVar15;
        local_d8.field_2._8_8_ = puVar12[3];
        local_d8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar15;
        local_d8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_d8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar9) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// Arrays of images/samplers in MSL are always const.
	if (!type.array.empty() && type_is_image)
		constref = true;

	string decl;
	if (constref)
		decl += "const ";

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = is_builtin_variable(var);
	is_using_builtin_array = builtin;
	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl += type_to_glsl(type, arg.id);
	else if (builtin)
		decl += builtin_type_decl(static_cast<BuiltIn>(get_decoration(arg.id, DecorationBuiltIn)), arg.id);
	else if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl += join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
		decl += type_to_glsl(type, arg.id);

	bool opaque_handle = storage == StorageClassUniformConstant;

	if (!builtin && !opaque_handle && !is_pointer &&
	    (storage == StorageClassFunction || storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of images and samplers are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		if (msl_options.argument_buffers)
		{
			uint32_t desc_set = get_decoration(name_id, DecorationDescriptorSet);
			if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) &&
			    descriptor_set_is_argument_buffer(desc_set))
			{
				// An awkward case where we need to emit *more* address space declarations (yay!).
				// An example is where we pass down an array of buffer pointers to leaf functions.
				// It's a constant array containing pointers to constants.
				// The pointer array is always constant however. E.g.
				// device SSBO * constant (&array)[N].
				// const device SSBO * constant (&array)[N].
				// constant SSBO * constant (&array)[N].
				// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
				// we emit the buffer array on stack instead, and that seems to work just fine apparently.

				// If the argument was marked as being in device address space, any pointer to member would
				// be const device, not constant.
				if (argument_buffer_device_storage_mask & (1u << desc_set))
					decl += " const device";
				else
					decl += " constant";
			}
		}

		decl += " (&";
		const char *restrict_kw = to_restrict(name_id);
		if (*restrict_kw)
		{
			decl += " ";
			decl += restrict_kw;
		}
		decl += to_expression(name_id);
		decl += ")";
		decl += type_to_array_glsl(type);
	}
	else if (!opaque_handle)
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (decl.back() == '*')
				decl += join(" ", address_space, " ");
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id);
		decl += to_expression(name_id);
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}